

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_init_ram_mips64
               (uc_struct_conflict6 *uc,MemoryRegion *mr,uint64_t size,uint32_t perms)

{
  RAMBlock *pRVar1;
  
  memory_region_init_mips64(uc,mr,size);
  mr->ram = true;
  if ((perms & 2) == 0) {
    mr->readonly = true;
  }
  mr->perms = perms;
  mr->terminates = true;
  mr->destructor = memory_region_destructor_ram;
  pRVar1 = qemu_ram_alloc_mips64(uc,size,mr);
  mr->ram_block = pRVar1;
  return;
}

Assistant:

void memory_region_init_ram(struct uc_struct *uc,
                            MemoryRegion *mr,
                            uint64_t size,
                            uint32_t perms)
{
    memory_region_init(uc, mr, size);
    mr->ram = true;
    if (!(perms & UC_PROT_WRITE)) {
        mr->readonly = true;
    }
    mr->perms = perms;
    mr->terminates = true;
    mr->destructor = memory_region_destructor_ram;
    mr->ram_block = qemu_ram_alloc(uc, size, mr);
}